

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool load_png(char *pFilename,image_u8 *img)

{
  uint uVar1;
  color_quad_u8_vec *this;
  reference __dest;
  reference __src;
  image_u8 *in_RSI;
  undefined8 in_RDI;
  bool bVar2;
  uint e;
  uint h;
  uint w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  image_u8 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  LodePNGColorType in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  image_u8 *local_18;
  undefined8 local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  image_u8::clear(in_stack_ffffffffffffff60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x138b4e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  uVar1 = lodepng::decode(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  bVar2 = uVar1 == 0;
  if (bVar2) {
    image_u8::init(local_18,(EVP_PKEY_CTX *)0x0);
    this = image_u8::get_pixels(local_18);
    __dest = std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::operator[](this,0);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,0);
    memcpy(__dest,__src,0);
  }
  else {
    fprintf(_stderr,"Failed loading PNG file %s\n",local_10);
  }
  local_1 = bVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff70));
  return (bool)(local_1 & 1);
}

Assistant:

static bool load_png(const char *pFilename, image_u8 &img)
{
	img.clear();

	std::vector<unsigned char> pixels;
	unsigned int w = 0, h = 0;
	unsigned int e = lodepng::decode(pixels, w, h, pFilename);
	if (e != 0)
	{
		fprintf(stderr, "Failed loading PNG file %s\n", pFilename);
		return false;
	}

	img.init(w, h);
	memcpy(&img.get_pixels()[0], &pixels[0], w * h * sizeof(uint32_t));
	
	return true;
}